

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_pool32axf_nanomips_insn(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGContext_conflict6 *tcg_ctx_00;
  uint uVar1;
  TCGv_i64 pTVar2;
  TCGv_i64 pTVar3;
  TCGv_i64 pTVar4;
  TCGv_i32 pTVar5;
  TCGv_i64 pTVar6;
  TCGv_i64 pTVar7;
  TCGv_i64 ret;
  uint rd;
  uintptr_t o_4;
  uint32_t uVar8;
  uint reg;
  uintptr_t o_2;
  uint reg_00;
  uintptr_t o;
  uintptr_t o_1;
  TCGTemp *ts;
  uint uVar10;
  ulong uVar9;
  
  uVar10 = ctx->opcode;
  uVar1 = uVar10 >> 6 & 7;
  if (6 < uVar1 - 1) {
switchD_008754c3_caseD_3:
    generate_exception_end(ctx,0x14);
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  reg_00 = uVar10 >> 0x15 & 0x1f;
  reg = uVar10 >> 0x10 & 0x1f;
  uVar9 = (ulong)reg;
  rd = uVar10 >> 0xb & 0x1f;
  switch(uVar1) {
  case 1:
    break;
  case 2:
    pTVar4 = tcg_temp_new_i64(tcg_ctx);
    pTVar3 = tcg_temp_new_i64(tcg_ctx);
    pTVar7 = tcg_temp_new_i64(tcg_ctx);
    pTVar2 = tcg_temp_new_i64(tcg_ctx);
    gen_load_gpr(tcg_ctx,pTVar7,reg_00);
    gen_load_gpr(tcg_ctx,pTVar2,reg);
    switch(uVar10 >> 0xc & 3) {
    case 0:
      switch(ctx->opcode >> 9 & 7) {
      default:
        uVar8 = 0;
LAB_008758e8:
        gen_pool32axf_2_multiply(ctx,uVar8,pTVar7,pTVar2,rd);
        break;
      case 4:
        check_dsp_r2(ctx);
        if (reg_00 != 0) {
          gen_load_gpr(tcg_ctx,pTVar4,reg);
          if ((uVar10 >> 0xb & 1) != 0) {
            uVar10 = uVar10 >> 0xb & 3;
            tcg_gen_shli_i64_mips64el
                      (tcg_ctx,tcg_ctx->cpu_gpr[reg_00],tcg_ctx->cpu_gpr[reg_00],(ulong)(uVar10 * 8)
                      );
            tcg_gen_ext32u_i64_mips64el(tcg_ctx,pTVar4,pTVar4);
            tcg_gen_shri_i64_mips64el(tcg_ctx,pTVar4,pTVar4,(ulong)(uVar10 * -8 + 0x20));
            tcg_gen_or_i64_mips64el
                      (tcg_ctx,tcg_ctx->cpu_gpr[reg_00],tcg_ctx->cpu_gpr[reg_00],pTVar4);
          }
          tcg_gen_ext32s_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[reg_00],tcg_ctx->cpu_gpr[reg_00]);
        }
        break;
      case 5:
        check_dsp(ctx);
        uVar8 = ctx->opcode;
        pTVar6 = tcg_temp_new_i64(tcg_ctx);
        ret = tcg_temp_new_i64(tcg_ctx);
        gen_load_gpr(tcg_ctx,pTVar4,reg_00);
        gen_load_gpr(tcg_ctx,pTVar3,reg);
LAB_00876747:
        tcg_gen_mov_i64_mips64el(tcg_ctx,pTVar6,pTVar4);
        tcg_gen_mov_i64_mips64el(tcg_ctx,ret,pTVar3);
        tcg_gen_mul_i64_mips64el(tcg_ctx,pTVar6,pTVar6,ret);
        uVar9 = (ulong)(uVar8 >> 0xb & 0x18);
        tcg_gen_concat32_i64
                  (tcg_ctx,ret,*(TCGv_i64 *)((long)tcg_ctx->cpu_LO + uVar9),
                   *(TCGv_i64 *)((long)tcg_ctx->cpu_HI + uVar9));
        tcg_gen_add_i64(tcg_ctx,pTVar6,pTVar6,ret);
LAB_008767a8:
        tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
        tcg_gen_ext32s_i64_mips64el(tcg_ctx,*(TCGv_i64 *)((long)tcg_ctx->cpu_LO + uVar9),pTVar6);
        gen_move_high32(tcg_ctx,*(TCGv_i64 *)((long)tcg_ctx->cpu_HI + uVar9),pTVar6);
        goto LAB_00876922;
      case 6:
        check_dsp(ctx);
        uVar8 = ctx->opcode;
        pTVar5 = tcg_temp_new_i32(tcg_ctx);
        pTVar6 = (TCGv_i64)tcg_temp_new_i32(tcg_ctx);
        gen_load_gpr(tcg_ctx,pTVar4,reg);
        gen_load_gpr(tcg_ctx,pTVar3,reg_00);
        tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,pTVar5,pTVar4);
        tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,(TCGv_i32)pTVar6,pTVar3);
        tcg_gen_muls2_i32_mips64el(tcg_ctx,pTVar5,(TCGv_i32)pTVar6,pTVar5,(TCGv_i32)pTVar6);
LAB_008768e6:
        uVar9 = (ulong)(uVar8 >> 0xb & 0x18);
        tcg_gen_ext_i32_i64_mips64el(tcg_ctx,*(TCGv_i64 *)((long)tcg_ctx->cpu_LO + uVar9),pTVar5);
        tcg_gen_ext_i32_i64_mips64el
                  (tcg_ctx,*(TCGv_i64 *)((long)tcg_ctx->cpu_HI + uVar9),(TCGv_i32)pTVar6);
        tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
LAB_00876922:
        tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
        break;
      case 7:
        check_dsp(ctx);
        gen_load_gpr(tcg_ctx,pTVar2,reg);
        tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar4,(ulong)(rd >> 3));
        gen_helper_extr_w(tcg_ctx,pTVar4,pTVar4,pTVar2,tcg_ctx->cpu_env);
        goto LAB_0087659d;
      }
      break;
    case 1:
      switch(ctx->opcode >> 9 & 7) {
      default:
        uVar8 = 1;
        goto LAB_008758e8;
      case 4:
        generate_exception_end(ctx,0x14);
        break;
      case 5:
        check_dsp(ctx);
        uVar8 = ctx->opcode;
        pTVar6 = tcg_temp_new_i64(tcg_ctx);
        ret = tcg_temp_new_i64(tcg_ctx);
        gen_load_gpr(tcg_ctx,pTVar4,reg);
        gen_load_gpr(tcg_ctx,pTVar3,reg_00);
        tcg_gen_ext32u_i64_mips64el(tcg_ctx,pTVar4,pTVar4);
        tcg_gen_ext32u_i64_mips64el(tcg_ctx,pTVar3,pTVar3);
        goto LAB_00876747;
      case 6:
        check_dsp(ctx);
        uVar8 = ctx->opcode;
        pTVar5 = tcg_temp_new_i32(tcg_ctx);
        pTVar6 = (TCGv_i64)tcg_temp_new_i32(tcg_ctx);
        gen_load_gpr(tcg_ctx,pTVar4,reg);
        gen_load_gpr(tcg_ctx,pTVar3,reg_00);
        tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,pTVar5,pTVar4);
        tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,(TCGv_i32)pTVar6,pTVar3);
        tcg_gen_mulu2_i32_mips64el(tcg_ctx,pTVar5,(TCGv_i32)pTVar6,pTVar5,(TCGv_i32)pTVar6);
        goto LAB_008768e6;
      case 7:
        check_dsp(ctx);
        tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar4,(ulong)(rd >> 3));
        gen_helper_extr_r_w(tcg_ctx,pTVar4,pTVar4,pTVar2,tcg_ctx->cpu_env);
        goto LAB_0087659d;
      }
      break;
    case 2:
      switch(ctx->opcode >> 9 & 7) {
      default:
        uVar8 = 2;
        goto LAB_008758e8;
      case 4:
        check_dsp(ctx);
        tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar4,(ulong)(rd >> 3));
        gen_helper_extp(tcg_ctx,pTVar4,pTVar4,pTVar2,tcg_ctx->cpu_env);
        break;
      case 5:
        check_dsp(ctx);
        uVar8 = ctx->opcode;
        pTVar6 = tcg_temp_new_i64(tcg_ctx);
        ret = tcg_temp_new_i64(tcg_ctx);
        gen_load_gpr(tcg_ctx,pTVar4,reg);
        gen_load_gpr(tcg_ctx,pTVar3,reg_00);
LAB_00876625:
        tcg_gen_mov_i64_mips64el(tcg_ctx,pTVar6,pTVar4);
        tcg_gen_mov_i64_mips64el(tcg_ctx,ret,pTVar3);
        tcg_gen_mul_i64_mips64el(tcg_ctx,pTVar6,pTVar6,ret);
        uVar9 = (ulong)(uVar8 >> 0xb & 0x18);
        tcg_gen_concat32_i64
                  (tcg_ctx,ret,*(TCGv_i64 *)((long)tcg_ctx->cpu_LO + uVar9),
                   *(TCGv_i64 *)((long)tcg_ctx->cpu_HI + uVar9));
        tcg_gen_sub_i64(tcg_ctx,pTVar6,ret,pTVar6);
        goto LAB_008767a8;
      case 7:
        check_dsp(ctx);
        tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar4,(ulong)(rd >> 3));
        gen_helper_extr_rs_w(tcg_ctx,pTVar4,pTVar4,pTVar2,tcg_ctx->cpu_env);
      }
LAB_0087659d:
      gen_store_gpr(tcg_ctx,pTVar4,reg_00);
      break;
    case 3:
      switch(ctx->opcode >> 9 & 7) {
      default:
        uVar8 = 3;
        goto LAB_008758e8;
      case 4:
        check_dsp(ctx);
        tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar4,(ulong)(rd >> 3));
        gen_helper_extpdp(tcg_ctx,pTVar4,pTVar4,pTVar2,tcg_ctx->cpu_env);
        goto LAB_0087659d;
      case 5:
        check_dsp(ctx);
        uVar8 = ctx->opcode;
        pTVar6 = tcg_temp_new_i64(tcg_ctx);
        ret = tcg_temp_new_i64(tcg_ctx);
        gen_load_gpr(tcg_ctx,pTVar4,reg);
        gen_load_gpr(tcg_ctx,pTVar3,reg_00);
        tcg_gen_ext32u_i64_mips64el(tcg_ctx,pTVar4,pTVar4);
        tcg_gen_ext32u_i64_mips64el(tcg_ctx,pTVar3,pTVar3);
        goto LAB_00876625;
      case 7:
        check_dsp(ctx);
        tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar4,(ulong)(rd >> 3));
        gen_helper_extr_s_h(tcg_ctx,pTVar4,pTVar4,pTVar7,tcg_ctx->cpu_env);
        gen_store_gpr(tcg_ctx,pTVar4,reg_00);
      }
    }
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar7 + (long)tcg_ctx));
    ts = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
    goto LAB_0087696a;
  default:
    goto switchD_008754c3_caseD_3;
  case 4:
    uVar10 = uVar10 >> 9 & 0x7f;
    pTVar4 = tcg_temp_new_i64(tcg_ctx);
    pTVar3 = tcg_temp_new_i64(tcg_ctx);
    gen_load_gpr(tcg_ctx,pTVar3,reg);
    switch(uVar10) {
    case 0:
      check_dsp_r2(ctx);
      gen_helper_absq_s_qb(tcg_ctx,pTVar3,pTVar3,tcg_ctx->cpu_env);
      break;
    case 1:
      check_dsp(ctx);
      tcg_gen_ext16u_i64_mips64el(tcg_ctx,pTVar3,pTVar3);
      goto LAB_00875e41;
    case 2:
    case 3:
    case 4:
    case 6:
    case 7:
switchD_008759a4_caseD_2:
      generate_exception_end(ctx,0x14);
      goto LAB_008760a8;
    case 5:
      gen_bitswap(ctx,0x7c000020,reg_00,reg);
      goto LAB_008760a8;
    case 8:
      check_dsp(ctx);
      gen_helper_absq_s_ph(tcg_ctx,pTVar3,pTVar3,tcg_ctx->cpu_env);
      break;
    case 9:
      check_dsp(ctx);
      tcg_gen_ext8u_i64_mips64el(tcg_ctx,pTVar3,pTVar3);
      tcg_gen_shli_i64_mips64el(tcg_ctx,pTVar4,pTVar3,8);
      tcg_gen_or_i64_mips64el(tcg_ctx,pTVar3,pTVar3,pTVar4);
LAB_00875e41:
      tcg_gen_shli_i64_mips64el(tcg_ctx,pTVar4,pTVar3,0x10);
      tcg_gen_or_i64_mips64el(tcg_ctx,pTVar3,pTVar3,pTVar4);
LAB_0087603c:
      tcg_gen_ext32s_i64_mips64el(tcg_ctx,pTVar3,pTVar3);
      break;
    default:
      if (uVar10 == 0x10) {
        check_dsp(ctx);
        gen_helper_absq_s_w(tcg_ctx,pTVar3,pTVar3,tcg_ctx->cpu_env);
        break;
      }
      if (uVar10 == 0x18) {
        check_dsp(ctx);
        gen_helper_bitrev(tcg_ctx,pTVar3,pTVar3);
        break;
      }
      if (uVar10 == 0x20) {
        check_dsp(ctx);
        pTVar7 = tcg_temp_new_i64(tcg_ctx);
        gen_load_gpr(tcg_ctx,pTVar7,reg_00);
        gen_helper_insv(tcg_ctx,pTVar3,tcg_ctx->cpu_env,pTVar3,pTVar7);
        gen_store_gpr(tcg_ctx,pTVar3,reg_00);
        tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar7 + (long)tcg_ctx));
        goto LAB_008760a8;
      }
      if (uVar10 == 0x25) {
        check_nms(ctx);
        uVar8 = 0x70000021;
LAB_00875efa:
        gen_cl(ctx,uVar8,reg_00,reg);
        goto LAB_008760a8;
      }
      if (uVar10 == 0x28) {
        check_dsp(ctx);
        tcg_gen_andi_i64_mips64el(tcg_ctx,pTVar3,pTVar3,0xffff0000);
      }
      else {
        if (uVar10 == 0x2d) {
          check_nms(ctx);
          uVar8 = 0x70000020;
          goto LAB_00875efa;
        }
        if (uVar10 != 0x30) {
          if (uVar10 == 0x38) {
            check_dsp(ctx);
            gen_helper_precequ_ph_qbl(tcg_ctx,pTVar3,pTVar3);
          }
          else if (uVar10 == 0x39) {
            check_dsp(ctx);
            gen_helper_precequ_ph_qbla(tcg_ctx,pTVar3,pTVar3);
          }
          else {
            if (uVar10 == 0x3d) {
              gen_bshfl(ctx,0x7c0000a0,reg_00,reg);
              goto LAB_008760a8;
            }
            if (uVar10 == 0x48) {
              check_dsp(ctx);
              gen_helper_precequ_ph_qbr(tcg_ctx,pTVar3,pTVar3);
            }
            else if (uVar10 == 0x49) {
              check_dsp(ctx);
              gen_helper_precequ_ph_qbra(tcg_ctx,pTVar3,pTVar3);
            }
            else if (uVar10 == 0x58) {
              check_dsp(ctx);
              gen_helper_preceu_ph_qbl(tcg_ctx,pTVar3,pTVar3);
            }
            else if (uVar10 == 0x59) {
              check_dsp(ctx);
              gen_helper_preceu_ph_qbla(tcg_ctx,pTVar3,pTVar3);
            }
            else if (uVar10 == 0x68) {
              check_dsp(ctx);
              gen_helper_preceu_ph_qbr(tcg_ctx,pTVar3,pTVar3);
            }
            else if (uVar10 == 0x69) {
              check_dsp(ctx);
              gen_helper_preceu_ph_qbra(tcg_ctx,pTVar3,pTVar3);
            }
            else {
              if (uVar10 != 0x78) goto switchD_008759a4_caseD_2;
              check_dsp(ctx);
              gen_helper_raddu_w_qb(tcg_ctx,pTVar3,pTVar3);
            }
          }
          break;
        }
        check_dsp(ctx);
        tcg_gen_andi_i64_mips64el(tcg_ctx,pTVar3,pTVar3,0xffff);
        tcg_gen_shli_i64_mips64el(tcg_ctx,pTVar3,pTVar3,0x10);
      }
      goto LAB_0087603c;
    }
    gen_store_gpr(tcg_ctx,pTVar3,reg_00);
LAB_008760a8:
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    ts = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
    goto LAB_0087696a;
  case 5:
    uVar10 = uVar10 >> 9 & 0x7f;
    switch(uVar10) {
    case 0x70:
      gen_load_srsgpr(tcg_ctx,reg,reg_00);
      return;
    case 0x71:
      uVar8 = 0x4200001f;
      break;
    case 0x72:
    case 0x73:
    case 0x74:
    case 0x75:
    case 0x76:
    case 0x77:
      goto switchD_008754c3_caseD_3;
    case 0x78:
      gen_store_srsgpr(tcg_ctx,reg,reg_00);
      return;
    case 0x79:
      uVar8 = 0x42000018;
      break;
    default:
      if (uVar10 == 0x61) {
        uVar8 = 0x42000020;
        break;
      }
      if (uVar10 == 3) {
        uVar8 = 0x42000003;
        break;
      }
      if (uVar10 == 9) {
        uVar8 = 0x42000001;
        break;
      }
      if (uVar10 == 0xb) {
        uVar8 = 0x42000004;
        break;
      }
      if (uVar10 == 0x11) {
        uVar8 = 0x42000002;
        break;
      }
      if (uVar10 == 0x19) {
        uVar8 = 0x42000006;
        break;
      }
      if (uVar10 == 0x23) {
        check_cp0_enabled(ctx);
        pTVar4 = tcg_temp_new_i64(tcg_ctx);
        save_cpu_state(ctx,1);
        gen_helper_di(tcg_ctx,pTVar4,tcg_ctx->cpu_env);
      }
      else {
        if (uVar10 != 0x2b) {
          if (uVar10 != 1) goto switchD_008754c3_caseD_3;
          uVar8 = 0x42000008;
          break;
        }
        check_cp0_enabled(ctx);
        pTVar4 = tcg_temp_new_i64(tcg_ctx);
        save_cpu_state(ctx,1);
        gen_helper_ei(tcg_ctx,pTVar4,tcg_ctx->cpu_env);
      }
      gen_store_gpr(tcg_ctx,pTVar4,reg_00);
      (ctx->base).is_jmp = DISAS_TARGET_0;
      goto LAB_00875c2e;
    }
    gen_cp0(env,ctx,uVar8,0,0);
    return;
  case 7:
    uVar10 = uVar10 >> 9 & 7;
    pTVar3 = tcg_temp_new_i64(tcg_ctx);
    pTVar4 = tcg_temp_new_i64(tcg_ctx);
    gen_load_gpr(tcg_ctx,pTVar4,reg);
    if (uVar10 == 2) {
      check_dsp(ctx);
      tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar3,(long)(int)((ctx->opcode >> 0xd & 0xff) * 0x1010101))
      ;
LAB_00875c15:
      gen_store_gpr(tcg_ctx,pTVar3,reg_00);
    }
    else {
      if (uVar10 == 1) {
        check_dsp_r2(ctx);
        tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar3,(ulong)(rd >> 1));
        gen_helper_shrl_ph(tcg_ctx,pTVar3,pTVar3,pTVar4);
        goto LAB_00875c15;
      }
      if (uVar10 == 0) {
        check_dsp_r2(ctx);
        tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar3,(ulong)(rd >> 2));
        if ((ctx->opcode & 0x1000) == 0) {
          gen_helper_shra_qb(tcg_ctx,pTVar3,pTVar3,pTVar4);
        }
        else {
          gen_helper_shra_r_qb(tcg_ctx,pTVar3,pTVar3,pTVar4);
        }
        goto LAB_00875c15;
      }
      generate_exception_end(ctx,0x14);
    }
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
LAB_00875c2e:
    ts = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
    goto LAB_0087696a;
  }
  pTVar4 = tcg_temp_new_i64(tcg_ctx);
  pTVar3 = tcg_temp_new_i64(tcg_ctx);
  pTVar7 = tcg_temp_new_i64(tcg_ctx);
  gen_load_gpr(tcg_ctx,pTVar7,reg);
  switch(uVar10 >> 9 & 7) {
  case 0:
    check_dsp(ctx);
    switch(ctx->opcode >> 0xc & 3) {
    case 0:
      uVar8 = 0x10;
      break;
    case 1:
      uVar8 = 0x12;
      break;
    case 2:
      uVar8 = 0x11;
      reg_00 = reg;
      break;
    case 3:
      uVar8 = 0x13;
      reg_00 = reg;
    }
    gen_HILO(ctx,uVar8,rd >> 3,reg_00);
    break;
  case 1:
    check_dsp(ctx);
    uVar10 = ctx->opcode >> 0xc & 3;
    if (uVar10 == 1) {
      tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar4,(ulong)(rd >> 3));
      gen_helper_shilo(tcg_ctx,pTVar4,pTVar7,tcg_ctx->cpu_env);
    }
    else {
      if (uVar10 != 0) goto switchD_00875529_caseD_2;
      tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar4,(ulong)rd);
      gen_helper_mthlip(tcg_ctx,pTVar4,pTVar7,tcg_ctx->cpu_env);
    }
    break;
  default:
switchD_00875529_caseD_2:
    generate_exception_end(ctx,0x14);
    break;
  case 3:
    check_dsp(ctx);
    uVar10 = ctx->opcode >> 0xe & 0x7f;
    switch(ctx->opcode >> 0xc & 3) {
    case 0:
      tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar4,(ulong)uVar10);
      gen_helper_rddsp(tcg_ctx,pTVar4,pTVar4,tcg_ctx->cpu_env);
      goto LAB_00875c7d;
    case 1:
      gen_load_gpr(tcg_ctx,pTVar4,reg_00);
      tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar3,(ulong)uVar10);
      gen_helper_wrdsp(tcg_ctx,pTVar4,pTVar3,tcg_ctx->cpu_env);
      goto LAB_00876235;
    case 2:
      tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar4,(ulong)(rd >> 3));
      tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar3,uVar9);
      gen_helper_extp(tcg_ctx,pTVar4,pTVar4,pTVar3,tcg_ctx->cpu_env);
      break;
    case 3:
      tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar4,(ulong)(rd >> 3));
      tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar3,uVar9);
      gen_helper_extpdp(tcg_ctx,pTVar4,pTVar4,pTVar3,tcg_ctx->cpu_env);
    }
    goto LAB_008761e2;
  case 4:
    check_dsp(ctx);
    tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar4,(ulong)(rd >> 2));
    if ((ctx->opcode & 0x1000) == 0) {
      gen_helper_shll_qb(tcg_ctx,pTVar4,pTVar4,pTVar7,tcg_ctx->cpu_env);
    }
    else {
      gen_helper_shrl_qb(tcg_ctx,pTVar4,pTVar4,pTVar7);
    }
LAB_00875c7d:
    gen_store_gpr(tcg_ctx,pTVar4,reg_00);
    break;
  case 5:
    uVar10 = ctx->opcode;
    tcg_ctx_00 = ctx->uc->tcg_ctx;
    pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar2 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
    tcg_gen_movi_i32(tcg_ctx_00,pTVar5,rd >> 3);
    gen_load_gpr(tcg_ctx_00,pTVar2,reg_00);
    gen_load_gpr(tcg_ctx_00,pTVar6,reg);
    switch(uVar10 >> 0xc & 3) {
    case 0:
      check_dsp(ctx);
      gen_helper_maq_s_w_phr(tcg_ctx_00,pTVar5,pTVar6,pTVar2,tcg_ctx_00->cpu_env);
      break;
    case 1:
      check_dsp(ctx);
      gen_helper_maq_s_w_phl(tcg_ctx_00,pTVar5,pTVar6,pTVar2,tcg_ctx_00->cpu_env);
      break;
    case 2:
      check_dsp(ctx);
      gen_helper_maq_sa_w_phr(tcg_ctx_00,pTVar5,pTVar6,pTVar2,tcg_ctx_00->cpu_env);
      break;
    case 3:
      check_dsp(ctx);
      gen_helper_maq_sa_w_phl(tcg_ctx_00,pTVar5,pTVar6,pTVar2,tcg_ctx_00->cpu_env);
    }
    tcg_temp_free_internal_mips64el(tcg_ctx_00,(TCGTemp *)(pTVar5 + (long)tcg_ctx_00));
    tcg_temp_free_internal_mips64el(tcg_ctx_00,(TCGTemp *)(pTVar2 + (long)tcg_ctx_00));
    tcg_temp_free_internal_mips64el(tcg_ctx_00,(TCGTemp *)(pTVar6 + (long)tcg_ctx_00));
    break;
  case 7:
    check_dsp(ctx);
    tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar4,(ulong)(rd >> 3));
    tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar3,uVar9);
    switch(ctx->opcode >> 0xc & 3) {
    case 0:
      gen_helper_extr_w(tcg_ctx,pTVar4,pTVar4,pTVar3,tcg_ctx->cpu_env);
      break;
    case 1:
      gen_helper_extr_r_w(tcg_ctx,pTVar4,pTVar4,pTVar3,tcg_ctx->cpu_env);
      break;
    case 2:
      gen_helper_extr_rs_w(tcg_ctx,pTVar4,pTVar4,pTVar3,tcg_ctx->cpu_env);
      break;
    case 3:
      gen_helper_extr_s_h(tcg_ctx,pTVar4,pTVar4,pTVar3,tcg_ctx->cpu_env);
    }
LAB_008761e2:
    gen_store_gpr(tcg_ctx,pTVar4,reg_00);
  }
LAB_00876235:
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
  ts = (TCGTemp *)(pTVar7 + (long)tcg_ctx);
LAB_0087696a:
  tcg_temp_free_internal_mips64el(tcg_ctx,ts);
  return;
}

Assistant:

static void gen_pool32axf_nanomips_insn(CPUMIPSState *env, DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rt = extract32(ctx->opcode, 21, 5);
    int rs = extract32(ctx->opcode, 16, 5);
    int rd = extract32(ctx->opcode, 11, 5);

    switch (extract32(ctx->opcode, 6, 3)) {
    case NM_POOL32AXF_1:
        {
            int32_t op1 = extract32(ctx->opcode, 9, 3);
            gen_pool32axf_1_nanomips_insn(ctx, op1, rt, rs, rd);
        }
        break;
    case NM_POOL32AXF_2:
        {
            int32_t op1 = extract32(ctx->opcode, 12, 2);
            gen_pool32axf_2_nanomips_insn(ctx, op1, rt, rs, rd);
        }
        break;
    case NM_POOL32AXF_4:
        {
            int32_t op1 = extract32(ctx->opcode, 9, 7);
            gen_pool32axf_4_nanomips_insn(ctx, op1, rt, rs);
        }
        break;
    case NM_POOL32AXF_5:
        switch (extract32(ctx->opcode, 9, 7)) {
        case NM_TLBP:
            gen_cp0(env, ctx, OPC_TLBP, 0, 0);
            break;
        case NM_TLBR:
            gen_cp0(env, ctx, OPC_TLBR, 0, 0);
            break;
        case NM_TLBWI:
            gen_cp0(env, ctx, OPC_TLBWI, 0, 0);
            break;
        case NM_TLBWR:
            gen_cp0(env, ctx, OPC_TLBWR, 0, 0);
            break;
        case NM_TLBINV:
            gen_cp0(env, ctx, OPC_TLBINV, 0, 0);
            break;
        case NM_TLBINVF:
            gen_cp0(env, ctx, OPC_TLBINVF, 0, 0);
            break;
        case NM_DI:
            check_cp0_enabled(ctx);
            {
                TCGv t0 = tcg_temp_new(tcg_ctx);

                save_cpu_state(ctx, 1);
                gen_helper_di(tcg_ctx, t0, tcg_ctx->cpu_env);
                gen_store_gpr(tcg_ctx, t0, rt);
            /* Stop translation as we may have switched the execution mode */
                ctx->base.is_jmp = DISAS_STOP;
                tcg_temp_free(tcg_ctx, t0);
            }
            break;
        case NM_EI:
            check_cp0_enabled(ctx);
            {
                TCGv t0 = tcg_temp_new(tcg_ctx);

                save_cpu_state(ctx, 1);
                gen_helper_ei(tcg_ctx, t0, tcg_ctx->cpu_env);
                gen_store_gpr(tcg_ctx, t0, rt);
            /* Stop translation as we may have switched the execution mode */
                ctx->base.is_jmp = DISAS_STOP;
                tcg_temp_free(tcg_ctx, t0);
            }
            break;
        case NM_RDPGPR:
            gen_load_srsgpr(tcg_ctx, rs, rt);
            break;
        case NM_WRPGPR:
            gen_store_srsgpr(tcg_ctx, rs, rt);
            break;
        case NM_WAIT:
            gen_cp0(env, ctx, OPC_WAIT, 0, 0);
            break;
        case NM_DERET:
            gen_cp0(env, ctx, OPC_DERET, 0, 0);
            break;
        case NM_ERETX:
            gen_cp0(env, ctx, OPC_ERET, 0, 0);
            break;
        default:
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
    case NM_POOL32AXF_7:
        {
            int32_t op1 = extract32(ctx->opcode, 9, 3);
            gen_pool32axf_7_nanomips_insn(ctx, op1, rt, rs, rd);
        }
        break;
    default:
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}